

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,uchar value)

{
  byte bVar1;
  Debug *pDVar2;
  int iVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  char *shade;
  int v;
  char *local_48;
  char *local_40;
  int local_34;
  
  iVar3 = (int)CONCAT71(in_register_00000031,value);
  bVar1 = (this->_immediateFlags)._value | (this->_flags)._value;
  local_34 = iVar3;
  if ((bVar1 & 0x10) == 0) {
    this = print<int>(this,&local_34);
  }
  else {
    if (value < 0x33) {
      pcVar4 = "  ";
    }
    else if (value < 0x66) {
      pcVar4 = anon_var_dwarf_bea09;
    }
    else if (value < 0x99) {
      pcVar4 = anon_var_dwarf_bea20;
    }
    else if (value < 0xcc) {
      pcVar4 = anon_var_dwarf_bea2b;
    }
    else {
      pcVar4 = anon_var_dwarf_bea36;
    }
    local_40 = pcVar4;
    if ((bVar1 & 2) == 0) {
      print<char[8]>(this,(char (*) [8])"\x1b[38;2;");
      bVar1 = (this->_flags)._value;
      (this->_flags)._value = bVar1 | 4;
      local_48 = (char *)CONCAT44(local_48._4_4_,iVar3);
      pDVar2 = print<int>(this,(int *)&local_48);
      local_48 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_48);
      local_48 = (char *)CONCAT44(local_48._4_4_,iVar3);
      pDVar2 = print<int>(pDVar2,(int *)&local_48);
      local_48 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_48);
      local_48 = (char *)CONCAT44(local_48._4_4_,iVar3);
      pDVar2 = print<int>(pDVar2,(int *)&local_48);
      local_48 = "m\x1b[48;2;";
      pDVar2 = print<char_const*>(pDVar2,&local_48);
      local_48 = (char *)CONCAT44(local_48._4_4_,iVar3);
      pDVar2 = print<int>(pDVar2,(int *)&local_48);
      local_48 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_48);
      local_48 = (char *)CONCAT44(local_48._4_4_,iVar3);
      pDVar2 = print<int>(pDVar2,(int *)&local_48);
      local_48 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_48);
      local_48 = (char *)CONCAT44(local_48._4_4_,iVar3);
      pDVar2 = print<int>(pDVar2,(int *)&local_48);
      local_48 = "m";
      pDVar2 = print<char_const*>(pDVar2,&local_48);
      local_48 = pcVar4;
      pDVar2 = print<char_const*>(pDVar2,&local_48);
      local_48 = "\x1b[0m";
      print<char_const*>(pDVar2,&local_48);
      (this->_flags)._value = bVar1;
    }
    else {
      this = print<char_const*>(this,&local_40);
    }
  }
  return this;
}

Assistant:

Debug& Debug::operator<<(unsigned char value) {
    /* Convert to int to avoid infinite recursion to operator<<(unsigned char) */
    const int v = value;

    /* Print the value as a shade of gray */
    if((_immediateFlags|_flags) & Flag::Color) {
        const char* shade;
        if(value < 51)       shade = "  ";
        else if(value < 102) shade = "░░";
        else if(value < 153) shade = "▒▒";
        else if(value < 204) shade = "▓▓";
        else                 shade = "██";

        /* If ANSI colors are disabled, use just the shade */
        if((_immediateFlags|_flags) & Flag::DisableColors)
            return print(shade);
        else {
            print("\033[38;2;");

            /* Disable space between values for everything after the initial
               value */
            const Flags previousFlags = _flags;
            _flags = previousFlags|Flag::NoSpace;

            /* Set both background and foreground, reset back after */
            *this << v << ";" << v << ";" << v << "m\033[48;2;"
                << v << ";" << v << ";" << v << "m" << shade << "\033[0m";

            /* Reset original flags */
            _flags = previousFlags;
            return *this;
        }

    /* Otherwise print its numeric value */
    } else return print(v);
}